

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O1

void __thiscall
tchecker::details::expression_typechecker_t::normalize_clock_comparison
          (expression_typechecker_t *this,binary_operator_t *op,
          shared_ptr<tchecker::typed_expression_t> *left,
          shared_ptr<tchecker::typed_expression_t> *right,binary_expression_t *expr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  typed_binary_expression_t *ptVar2;
  element_type *peVar3;
  undefined8 uVar4;
  bool bVar5;
  binary_operator_t bVar6;
  long *plVar7;
  long *plVar8;
  ulong *puVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  _func_int **pp_Var12;
  undefined8 uVar13;
  expression_type_t new_left_type;
  undefined1 local_138 [40];
  undefined8 local_110;
  long local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  long lStack_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  long local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_e0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  expression_type_t local_4c;
  string local_48;
  
  bVar5 = predicate(*op);
  if (!bVar5) {
    return;
  }
  bVar5 = clock_involved(((right->
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->_type);
  if (!bVar5) {
    return;
  }
  bVar5 = clock_involved(((left->
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->_type);
  if (!bVar5) {
    peVar3 = (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         peVar3;
    p_Var10 = (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi =
         (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
    ._M_pi = p_Var10;
    bVar6 = reverse_cmp(*op);
    *op = bVar6;
    return;
  }
  local_4c = type_binary(EXPR_OP_MINUS,
                         ((left->
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->_type,
                         ((right->
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->_type);
  local_f0._M_pi._0_4_ = 7;
  local_138._0_8_ = (typed_binary_expression_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::typed_binary_expression_t,std::allocator<tchecker::typed_binary_expression_t>,tchecker::expression_type_t&,tchecker::binary_operator_t,std::shared_ptr<tchecker::typed_expression_t>&,std::shared_ptr<tchecker::typed_expression_t>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
             (typed_binary_expression_t **)local_138,
             (allocator<tchecker::typed_binary_expression_t> *)&local_110,&local_4c,
             (binary_operator_t *)&local_f0,left,right);
  uVar4 = local_138._8_8_;
  uVar13 = local_138._0_8_;
  local_138._0_8_ = (typed_binary_expression_t *)0x0;
  local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var10 = (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)uVar13;
  (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
  }
  local_f0._M_pi._0_4_ = 1;
  local_110 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_110._4_4_ << 0x20);
  local_138._0_8_ = (typed_binary_expression_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::typed_int_expression_t,std::allocator<tchecker::typed_int_expression_t>,tchecker::expression_type_t,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
             (typed_int_expression_t **)local_138,
             (allocator<tchecker::typed_int_expression_t> *)&local_d0,(expression_type_t *)&local_f0
             ,(int *)&local_110);
  uVar4 = local_138._8_8_;
  uVar13 = local_138._0_8_;
  local_138._0_8_ = (typed_binary_expression_t *)0x0;
  local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var10 = (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)uVar13;
  (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
  }
  if (((left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ->_type != EXPR_TYPE_BAD) {
    return;
  }
  expression_t::to_string_abi_cxx11_
            (&local_48,(expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1d5fab);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_c0 = *puVar9;
    lStack_b8 = plVar7[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar9;
    local_d0 = (ulong *)*plVar7;
  }
  local_c8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  expression_t::to_string_abi_cxx11_
            (&local_90,
             (expr->_left).
             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  uVar11 = 0xf;
  if (local_d0 != &local_c0) {
    uVar11 = local_c0;
  }
  if (uVar11 < local_90._M_string_length + local_c8) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar13 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_90._M_string_length + local_c8) goto LAB_001883dc;
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_001883dc:
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)local_90._M_dataplus._M_p);
  }
  local_110 = &local_100;
  p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar7 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar7 == p_Var1) {
    local_100._M_pi = p_Var1->_M_pi;
    lStack_f8 = plVar7[3];
  }
  else {
    local_100._M_pi = p_Var1->_M_pi;
    local_110 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar7;
  }
  local_108 = plVar7[1];
  *plVar7 = (long)p_Var1;
  plVar7[1] = 0;
  *(undefined1 *)&p_Var1->_M_pi = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar7 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7 == p_Var10) {
    local_e0._vptr__Sp_counted_base = p_Var10->_vptr__Sp_counted_base;
    local_e0._8_8_ = plVar7[3];
    local_f0._M_pi = &local_e0;
  }
  else {
    local_e0._vptr__Sp_counted_base = p_Var10->_vptr__Sp_counted_base;
    local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7;
  }
  local_e8 = plVar7[1];
  *plVar7 = (long)p_Var10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  expression_t::to_string_abi_cxx11_
            (&local_b0,
             (expr->_right).
             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pp_Var12 = (_func_int **)0xf;
  if (local_f0._M_pi != &local_e0) {
    pp_Var12 = local_e0._vptr__Sp_counted_base;
  }
  if (pp_Var12 < (_func_int **)(local_b0._M_string_length + local_e8)) {
    uVar13 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar13 = local_b0.field_2._M_allocated_capacity;
    }
    if ((_func_int **)(local_b0._M_string_length + local_e8) <= (ulong)uVar13) {
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_b0,0,(char *)0x0,(ulong)local_f0._M_pi);
      goto LAB_00188520;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)local_b0._M_dataplus._M_p);
LAB_00188520:
  local_138._0_8_ = local_138 + 0x10;
  ptVar2 = (typed_binary_expression_t *)(plVar7 + 2);
  if ((typed_binary_expression_t *)*plVar7 == ptVar2) {
    local_138._16_8_ = *(undefined8 *)&ptVar2->super_typed_expression_t;
    local_138._24_4_ = (undefined4)plVar7[3];
    local_138._28_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
  }
  else {
    local_138._16_8_ = *(undefined8 *)&ptVar2->super_typed_expression_t;
    local_138._0_8_ = (typed_binary_expression_t *)*plVar7;
  }
  local_138._8_8_ = plVar7[1];
  *plVar7 = (long)ptVar2;
  plVar7[1] = 0;
  *(undefined1 *)&ptVar2->super_typed_expression_t = 0;
  if ((this->_error).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->_error)._M_invoker)
              ((_Any_data *)&this->_error,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    if ((typed_binary_expression_t *)local_138._0_8_ !=
        (typed_binary_expression_t *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_f0._M_pi != &local_e0) {
      operator_delete(local_f0._M_pi,(long)local_e0._vptr__Sp_counted_base + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,(ulong)((long)&(local_100._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void normalize_clock_comparison(enum tchecker::binary_operator_t & op, std::shared_ptr<tchecker::typed_expression_t> & left,
                                  std::shared_ptr<tchecker::typed_expression_t> & right,
                                  tchecker::binary_expression_t const & expr)
  {
    // do not do anything if `op` is not a comparator or if not clock is involved on the right-hand side
    if (!tchecker::predicate(op) || !tchecker::clock_involved(right->type()))
      return;

    // `op` is a comparator and clocks appear on `right` but not on `left`: swap left/right and reverse op
    if (!tchecker::clock_involved(left->type())) {
      std::swap(left, right);
      op = tchecker::reverse_cmp(op);
    }
    // `op` is a comparator and clocks appear both on `left` and `right`: rewrite as left-right op 0
    else {
      enum tchecker::expression_type_t new_left_type = type_binary(tchecker::EXPR_OP_MINUS, left->type(), right->type());
      left = std::make_shared<tchecker::typed_binary_expression_t>(new_left_type, tchecker::EXPR_OP_MINUS, left, right);
      right = std::make_shared<tchecker::typed_int_expression_t>(tchecker::EXPR_TYPE_INTTERM, 0);
      if (left->type() == tchecker::EXPR_TYPE_BAD)
        _error("in expression " + expr.to_string() + ", invalid comparison of clock expressions " +
               expr.left_operand().to_string() + " and " + expr.right_operand().to_string());
    }
  }